

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Position.h
# Opt level: O0

hash_type __thiscall libchess::Position::calculate_pawn_hash(Position *this)

{
  Square color;
  value_type vVar1;
  uint64_t uVar2;
  Bitboard *in_RDI;
  Bitboard bb;
  Color c;
  Color *__end2;
  Color *__begin2;
  Color (*__range2) [2];
  hash_type hash_value;
  PieceType piece_type;
  Square square;
  Bitboard in_stack_ffffffffffffffc8;
  uint *local_20;
  hash_type local_10;
  
  local_10 = 0;
  for (local_20 = &constants::COLORS; local_20 != (uint *)&DAT_0013824c; local_20 = local_20 + 1) {
    piece_type.super_MetaValueType<int>.value_ = (MetaValueType<int>)*local_20;
    square.super_MetaValueType<int>.value_ = (MetaValueType<int>)0;
    in_stack_ffffffffffffffc8 =
         piece_type_bb((Position *)(ulong)(uint)piece_type.super_MetaValueType<int>.value_,
                       (MetaValueType<int>)(value_type)(in_stack_ffffffffffffffc8.value_ >> 0x20),
                       (MetaValueType<int>)(value_type)in_stack_ffffffffffffffc8.value_);
    while( true ) {
      vVar1 = Bitboard::operator_cast_to_unsigned_long((Bitboard *)&stack0xffffffffffffffc8);
      if (vVar1 == 0) break;
      color = Bitboard::forward_bitscan(in_RDI);
      uVar2 = zobrist::piece_square_key
                        (square,piece_type,(Color)color.super_MetaValueType<int>.value_);
      local_10 = uVar2 ^ local_10;
      Bitboard::forward_popbit((Bitboard *)&stack0xffffffffffffffc8);
    }
  }
  return local_10;
}

Assistant:

hash_type calculate_pawn_hash() const {
        hash_type hash_value = 0;
        for (Color c : constants::COLORS) {
            Bitboard bb = piece_type_bb(constants::PAWN, c);
            while (bb) {
                hash_value ^= zobrist::piece_square_key(bb.forward_bitscan(), constants::PAWN, c);
                bb.forward_popbit();
            }
        }
        return hash_value;
    }